

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::PostFlagParsingInit(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *__p;
  pointer ppPVar1;
  
  if (this->post_flag_parse_init_performed_ != false) {
    return;
  }
  this->post_flag_parse_init_performed_ = true;
  __p = ParseInternalRunDeathTestFlag();
  std::
  __uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
  ::reset((__uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           *)&this->internal_run_death_test_flag_,__p);
  if ((this->internal_run_death_test_flag_)._M_t.
      super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
      .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl !=
      (InternalRunDeathTestFlag *)0x0) {
    ((this->listeners_).repeater_)->forwarding_enabled_ = false;
  }
  if (this->parameterized_tests_registered_ == false) {
    for (ppPVar1 = (this->parameterized_test_registry_).test_case_infos_.
                   super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppPVar1 !=
        (this->parameterized_test_registry_).test_case_infos_.
        super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppPVar1 = ppPVar1 + 1) {
      (**(code **)(*(long *)*ppPVar1 + 0x20))();
    }
    this->parameterized_tests_registered_ = true;
  }
  ConfigureXmlOutput(this);
  ConfigureStreamingOutput(this);
  return;
}

Assistant:

void UnitTestImpl::PostFlagParsingInit() {
  // Ensures that this function does not execute more than once.
  if (!post_flag_parse_init_performed_) {
    post_flag_parse_init_performed_ = true;

#if defined(GTEST_CUSTOM_TEST_EVENT_LISTENER_)
    // Register to send notifications about key process state changes.
    listeners()->Append(new GTEST_CUSTOM_TEST_EVENT_LISTENER_());
#endif  // defined(GTEST_CUSTOM_TEST_EVENT_LISTENER_)

#if GTEST_HAS_DEATH_TEST
    InitDeathTestSubprocessControlInfo();
    SuppressTestEventsIfInSubprocess();
#endif  // GTEST_HAS_DEATH_TEST

    // Registers parameterized tests. This makes parameterized tests
    // available to the UnitTest reflection API without running
    // RUN_ALL_TESTS.
    RegisterParameterizedTests();

    // Configures listeners for XML output. This makes it possible for users
    // to shut down the default XML output before invoking RUN_ALL_TESTS.
    ConfigureXmlOutput();

#if GTEST_CAN_STREAM_RESULTS_
    // Configures listeners for streaming test results to the specified server.
    ConfigureStreamingOutput();
#endif  // GTEST_CAN_STREAM_RESULTS_

#if GTEST_HAS_ABSL
    if (GTEST_FLAG(install_failure_signal_handler)) {
      absl::FailureSignalHandlerOptions options;
      absl::InstallFailureSignalHandler(options);
    }
#endif  // GTEST_HAS_ABSL
  }
}